

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O1

void __thiscall TPZStream::Read(TPZStream *this,Fad<long_double> *p,int howMany)

{
  undefined8 *puVar1;
  void *pvVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Vector<long_double> *this_00;
  Fad<double> *rhs;
  Fad<long_double> local_68;
  
  lVar6 = (long)howMany * 0x20;
  uVar5 = 0xffffffffffffffff;
  if (-1 < howMany) {
    uVar5 = lVar6 + 8;
  }
  plVar3 = (long *)operator_new__(uVar5);
  rhs = (Fad<double> *)(plVar3 + 1);
  *plVar3 = (long)howMany;
  if (howMany != 0) {
    lVar4 = 0;
    do {
      *(undefined8 *)((long)plVar3 + lVar4 + 8) = 0;
      *(undefined4 *)((long)plVar3 + lVar4 + 0x10) = 0;
      puVar1 = (undefined8 *)((long)plVar3 + lVar4 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar4 = lVar4 + 0x20;
    } while (lVar6 != lVar4);
  }
  (*this->_vptr_TPZStream[0x31])(this,rhs,(ulong)(uint)howMany);
  if (howMany != 0) {
    uVar5 = (ulong)(uint)howMany;
    this_00 = &p->dx_;
    do {
      Fad<long_double>::Fad<double,_nullptr>(&local_68,rhs);
      *(longdouble *)(this_00 + -1) = local_68.val_;
      Vector<long_double>::operator=(this_00,&local_68.dx_);
      *(longdouble *)(this_00 + 1) = local_68.defaultVal;
      if (local_68.dx_.ptr_to_data != (longdouble *)0x0) {
        operator_delete__(local_68.dx_.ptr_to_data);
      }
      rhs = rhs + 1;
      this_00 = this_00 + 3;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
  }
  lVar6 = *plVar3 * 0x20;
  uVar5 = lVar6 + 8;
  lVar4 = *plVar3;
  while (lVar4 != 0) {
    pvVar2 = *(void **)((long)plVar3 + lVar6 + -8);
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    *(undefined4 *)((long)plVar3 + lVar6 + -0x10) = 0;
    *(undefined8 *)((long)plVar3 + lVar6 + -8) = 0;
    lVar6 = lVar6 + -0x20;
    lVar4 = lVar6;
  }
  operator_delete__(plVar3,uVar5);
  return;
}

Assistant:

void TPZStream::Read(Fad<long double> *p, int howMany) {//weird but necessary for working between different OSs
    Fad<double> *copy = new Fad<double>[howMany];
    Read(copy, howMany);
    for (unsigned int i = 0; i < howMany; ++i) {
        p[i] = (Fad<long double>)copy[i];
    }
    delete[] copy;
}